

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestHugeFieldNumbersLite_OptionalGroup::SharedDtor(MessageLite *self)

{
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestHugeFieldNumbersLite_OptionalGroup *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestHugeFieldNumbersLite_OptionalGroup *)self;
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
             ,0x27e0,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestHugeFieldNumbersLite_OptionalGroup::SharedDtor(MessageLite& self) {
  TestHugeFieldNumbersLite_OptionalGroup& this_ = static_cast<TestHugeFieldNumbersLite_OptionalGroup&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}